

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::StartNewSlab
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  uint uVar1;
  byte bVar2;
  size_t Sz;
  void *NewSlab;
  
  uVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
          super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size >> 7;
  bVar2 = 0x1e;
  if (uVar1 < 0x1e) {
    bVar2 = (byte)uVar1;
  }
  Sz = 0x1000L << (bVar2 & 0x3f);
  NewSlab = safe_malloc(Sz);
  SmallVectorTemplateBase<void_*,_true>::push_back
            ((SmallVectorTemplateBase<void_*,_true> *)&this->Slabs,&NewSlab);
  this->CurPtr = (char *)NewSlab;
  this->End = (char *)(Sz + (long)NewSlab);
  return;
}

Assistant:

void StartNewSlab() {
    size_t AllocatedSlabSize = computeSlabSize(Slabs.size());

    void *NewSlab = Allocator.Allocate(AllocatedSlabSize, 0);
    // We own the new slab and don't want anyone reading anything other than
    // pieces returned from this method.  So poison the whole slab.
    __asan_poison_memory_region(NewSlab, AllocatedSlabSize);

    Slabs.push_back(NewSlab);
    CurPtr = (char *)(NewSlab);
    End = ((char *)NewSlab) + AllocatedSlabSize;
  }